

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UgridReader.hpp
# Opt level: O3

vector<int,_std::allocator<int>_> *
Parfait::UgridReader::readQuads
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,string *filename,int begin,
          int end,bool swapBytes)

{
  int iVar1;
  pointer pcVar2;
  pointer piVar3;
  int *piVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  string *__rhs;
  int *vertex;
  FILE *__stream;
  long lVar9;
  int *piVar10;
  domain_error *this;
  vector<int,_std::allocator<int>_> *__range1;
  size_type __n;
  undefined1 auVar11 [16];
  allocator_type local_9d;
  int local_9c;
  int ntri;
  int nnodes;
  string *local_90;
  int nhex;
  int nprism;
  int npyr;
  int ntet;
  int nquad;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar2 = (filename->_M_dataplus)._M_p;
  local_90 = filename;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + filename->_M_string_length);
  readHeader(&local_70,&nnodes,&ntri,&nquad,&ntet,&npyr,&nprism,&nhex,swapBytes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  __n = (size_type)((end - begin) * 4);
  local_50._M_dataplus._M_p._0_4_ = 0;
  local_9c = end;
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,__n,(value_type_conflict2 *)&local_50,&local_9d);
  __rhs = local_90;
  __stream = fopen((local_90->_M_dataplus)._M_p,"rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,((long)(begin * 4) + (long)ntri * 3) * 4 + (long)nnodes * 0x18 + 0x1c,0);
    fread((__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start,4,__n,__stream);
    fclose(__stream);
    if (swapBytes && local_9c != begin) {
      lVar9 = 0;
      do {
        piVar3 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        iVar1 = piVar3[lVar9];
        auVar11._8_8_ = 0;
        auVar11._0_8_ =
             (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)iVar1 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)iVar1 >> 0x10),iVar1)) >>
                                                  0x20),iVar1) >> 0x18),
                                             CONCAT12((char)((uint)iVar1 >> 8),(short)iVar1)) >>
                                   0x10),(short)iVar1) & 0xffff00ff00ff00ff;
        auVar11 = pshuflw(auVar11,auVar11,0x1b);
        sVar5 = auVar11._0_2_;
        sVar6 = auVar11._2_2_;
        sVar7 = auVar11._4_2_;
        sVar8 = auVar11._6_2_;
        piVar3[lVar9] =
             CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar11[6] - (0xff < sVar8),
                      CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar11[4] - (0xff < sVar7),
                               CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar11[2] - (0xff < sVar6),
                                        (0 < sVar5) * (sVar5 < 0x100) * auVar11[0] - (0xff < sVar5))
                              ));
        lVar9 = lVar9 + 1;
      } while (__n + (__n == 0) != lVar9);
    }
    piVar4 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (piVar10 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start; piVar10 != piVar4; piVar10 = piVar10 + 1) {
      *piVar10 = *piVar10 + -1;
    }
    return __return_storage_ptr__;
  }
  this = (domain_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,"Could not open .ugrid file: ",__rhs);
  std::domain_error::domain_error(this,(string *)&local_50);
  __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

inline std::vector<int> Parfait::UgridReader::readQuads(std::string filename,int begin,int end,bool swapBytes) {
    int nnodes,ntri,nquad,ntet,npyr,nprism,nhex;
    // get header info and allocate space for triangles
    readHeader(filename,nnodes,ntri,nquad,ntet,npyr,nprism,nhex,swapBytes);
    int nrequested = end - begin;
    std::vector<int> quads(4*nrequested,0);

    FILE *f = fopen(filename.c_str(),"rb");
    if(f == NULL){
        throw std::domain_error("Could not open .ugrid file: "+filename);
    }
    unsigned long int byteOffset = 7*sizeof(int) + 3*nnodes*sizeof(double);
    byteOffset += 3*ntri*sizeof(int);
    byteOffset += 4*begin*sizeof(int);
    fseek(f,byteOffset,SEEK_SET);
    fread(&quads[0],sizeof(int),4*nrequested,f);
    fclose(f);
    if(swapBytes) {
        for (size_t i = 0; i < 4 * nrequested; i++) {
            bswap_32(&quads[i]);
        }
    }

    for(int& vertex : quads)
        vertex--;

    return quads;
}